

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O2

void diy::mpi::detail::gather_v
               (communicator *comm,void *dataIn,int countIn,datatype *type,void *dataOut,int *counts
               ,int *offsets,int root)

{
  MPI_Datatype poVar1;
  
  poVar1 = (type->handle).data;
  MPI_Gatherv(dataIn,countIn,poVar1,dataOut,counts,offsets,poVar1,root,(comm->comm_).data);
  return;
}

Assistant:

void gather_v(const communicator& comm,
              const void* dataIn, int countIn, const datatype& type,
              void* dataOut, const int counts[], const int offsets[],
              int root)
{
#if DIY_HAS_MPI
  MPI_Gatherv(dataIn, countIn, mpi_cast(type.handle),
              dataOut, counts, offsets, mpi_cast(type.handle),
              root, mpi_cast(comm.handle()));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), countIn);
  (void)comm; (void)counts, (void)offsets, (void)root;
#endif
}